

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

FBaseCVar * FindCVarSub(char *var_name,int namelen)

{
  int iVar1;
  char *__s1;
  char *probename;
  FBaseCVar *var;
  int namelen_local;
  char *var_name_local;
  
  if (var_name == (char *)0x0) {
    var_name_local = (char *)0x0;
  }
  else {
    for (probename = (char *)CVars; probename != (char *)0x0;
        probename = *(char **)(probename + 0x20)) {
      __s1 = FBaseCVar::GetName((FBaseCVar *)probename);
      iVar1 = strncasecmp(__s1,var_name,(long)namelen);
      if ((iVar1 == 0) && (__s1[namelen] == '\0')) break;
    }
    var_name_local = probename;
  }
  return (FBaseCVar *)var_name_local;
}

Assistant:

FBaseCVar *FindCVarSub (const char *var_name, int namelen)
{
	FBaseCVar *var;

	if (var_name == NULL)
		return NULL;

	var = CVars;
	while (var)
	{
		const char *probename = var->GetName ();

		if (strnicmp (probename, var_name, namelen) == 0 &&
			probename[namelen] == 0)
		{
			break;
		}
		var = var->m_Next;
	}
	return var;
}